

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_MFI_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_00000328;
  double *in_stack_00000330;
  double *in_stack_00000338;
  double *in_stack_00000340;
  int in_stack_0000034c;
  int in_stack_00000350;
  int in_stack_00000360;
  int *in_stack_00000368;
  int *in_stack_00000370;
  double *in_stack_00000378;
  
  TVar1 = TA_MFI(in_stack_00000350,in_stack_0000034c,in_stack_00000340,in_stack_00000338,
                 in_stack_00000330,in_stack_00000328,in_stack_00000360,in_stack_00000368,
                 in_stack_00000370,in_stack_00000378);
  return TVar1;
}

Assistant:

TA_RetCode TA_MFI_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_MFI(
/* Generated */             startIdx,
/* Generated */             endIdx,
/* Generated */             params->in[0].data.inPrice.high, /* inHigh */
/* Generated */             params->in[0].data.inPrice.low, /* inLow */
/* Generated */             params->in[0].data.inPrice.close, /* inClose */
/* Generated */             params->in[0].data.inPrice.volume, /* inVolume */
/* Generated */             params->optIn[0].data.optInInteger, /* optInTimePeriod*/
/* Generated */             outBegIdx, 
/* Generated */             outNBElement, 
/* Generated */             params->out[0].data.outReal /*  outReal */ );
/* Generated */ }